

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O3

void __thiscall RoboClaw::begin(RoboClaw *this,long speed)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  char *__s;
  undefined1 auVar4 [16];
  int local_5c;
  undefined1 local_58 [16];
  undefined8 uStack_48;
  cc_t acStack_40 [40];
  
  if (this->m_serial == -1) {
    iVar3 = open((this->m_portName)._M_dataplus._M_p,0x101102);
    this->m_serial = iVar3;
    if (iVar3 == -1) {
      perror("Unable to open serial device.");
      return;
    }
    acStack_40[8] = '\0';
    acStack_40[9] = '\0';
    acStack_40[10] = '\0';
    acStack_40[0xb] = '\0';
    acStack_40[0xc] = '\0';
    acStack_40[0xd] = '\0';
    acStack_40[0xe] = '\0';
    acStack_40[0xf] = '\0';
    acStack_40[0x10] = '\0';
    acStack_40[0x11] = '\0';
    acStack_40[0x12] = '\0';
    acStack_40[0x13] = '\0';
    acStack_40[0x14] = '\0';
    acStack_40[0x15] = '\0';
    acStack_40[0x16] = '\0';
    acStack_40[0x17] = '\0';
    acStack_40[0x18] = '\0';
    acStack_40[0x19] = 0;
    acStack_40[0x1a] = 0;
    acStack_40[0x1b] = 0;
    acStack_40._28_8_ = 0;
    local_58 = ZEXT816(0);
    uStack_48._0_1_ = '\0';
    uStack_48._1_1_ = '\0';
    uStack_48._2_1_ = '\0';
    uStack_48._3_1_ = '\0';
    uStack_48._4_1_ = '\0';
    uStack_48._5_1_ = '\0';
    uStack_48._6_1_ = '\0';
    uStack_48._7_1_ = '\0';
    acStack_40[0] = '\0';
    acStack_40[1] = '\0';
    acStack_40[2] = '\0';
    acStack_40[3] = '\0';
    acStack_40[4] = '\0';
    acStack_40[5] = '\0';
    acStack_40[6] = '\0';
    acStack_40[7] = '\0';
    iVar3 = tcgetattr(iVar3,(termios *)local_58);
    if (iVar3 == 0) {
      cfsetospeed((termios *)local_58,(speed_t)speed);
      cfsetispeed((termios *)local_58,(speed_t)speed);
      auVar4 = vpinsrd_avx(local_58,local_58._8_4_ & 0x7ffff20f,2);
      auVar1 = vpinsrd_avx(auVar4,local_58._12_4_,3);
      auVar1 = vpand_avx(auVar1,_DAT_001080b0);
      auVar2._8_4_ = 0xcb0;
      auVar2._0_8_ = 0xcb000000cb0;
      auVar2._12_4_ = 0xcb0;
      auVar4 = vpord_avx512vl(auVar4,auVar2);
      local_58 = vpblendd_avx2(auVar1,auVar4,4);
      iVar3 = tcsetattr(this->m_serial,0,(termios *)local_58);
      if (iVar3 == 0) {
        tcflush(this->m_serial,2);
        local_5c = 0;
        ioctl(this->m_serial,0x541b,&local_5c);
        if (0 < local_5c) {
          __buf = extraout_RDX;
          do {
            read(this,this->m_timeout,__buf,in_RCX);
            local_5c = 0;
            ioctl(this->m_serial,0x541b,&local_5c);
            __buf = extraout_RDX_00;
          } while (0 < local_5c);
        }
        fcntl(this->m_serial,4,0);
        return;
      }
      __s = "tcsetattr failed with error:";
    }
    else {
      __s = "error from tcgetattr";
    }
    perror(__s);
  }
  return;
}

Assistant:

void RoboClaw::begin(long speed)
{
    if( m_serial == -1 )
    {
        m_serial = open ( m_portName.c_str(), O_RDWR | O_NOCTTY | O_SYNC);

        if( m_serial == -1 )
        {
            perror( "Unable to open serial device." );
            return ;
        }

        struct termios tty;
        memset( &tty, 0, sizeof( tty ) );

        if( tcgetattr( m_serial, &tty ) != 0 )
        {
            perror( "error from tcgetattr" );
            return ;
        }

        cfsetospeed( &tty, speed );
        cfsetispeed( &tty, speed );

        // input
        tty.c_iflag &= ~IGNBRK;            // disable ignoring break
        tty.c_iflag &= ~(IGNPAR | PARMRK); // disable parity checks
        tty.c_iflag &= ~INPCK;             // disable parity checking
        tty.c_iflag &= ~ISTRIP;            // disable stripping 8th bit
        tty.c_iflag &= ~(INLCR | ICRNL);   // disable translating NL <-> CR
        tty.c_iflag &= ~IGNCR;             // disable ignoring CR
        tty.c_iflag &= ~(IXON | IXOFF);    // disable XON/XOFF flow control

        // output
        tty.c_oflag &= ~OPOST;            // disable output processing
        tty.c_oflag &= ~(ONLCR | OCRNL);   // disable translating NL <-> CR
        tty.c_oflag &= ~OFILL;            // disable fill characters

        // control flags
        tty.c_cflag |=   CLOCAL;           // prevent changing ownership
        tty.c_cflag |=   CREAD;            // enable reciever
        tty.c_cflag &= ~PARENB;           // disable parity
        tty.c_cflag &= ~CSTOPB;           // disable 2 stop bits
        tty.c_cflag &= ~CSIZE;            // remove size flag...
        tty.c_cflag |=   CS8;              // ...enable 8 bit characters
        tty.c_cflag |=   HUPCL;            // enable lower control lines on close - hang up
        tty.c_cflag &= ~CRTSCTS;          // disable hardware CTS/RTS flow control

        // local flags
        tty.c_lflag &= ~ISIG;             // disable generating signals
        tty.c_lflag &= ~ICANON;           // disable canonical mode - line by line
        tty.c_lflag &= ~ECHO;             // disable echoing characters
        tty.c_lflag &= ~ECHONL;           // ??
        tty.c_lflag &= ~NOFLSH;           // disable flushing on SIGINT
        tty.c_lflag &= ~IEXTEN;           // disable input processing

        if( tcsetattr( m_serial, TCSANOW, &tty ) != 0 )
        {
            perror( "tcsetattr failed with error:" );
            return ;
        }

        tcflush( m_serial, TCIOFLUSH );

        while( available() > 0 )
        {
            read( m_timeout );
        }

        fcntl( m_serial, F_SETFL, 0 );
    }
}